

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.cpp
# Opt level: O2

void __thiscall duckdb::CSVGlobalState::FinishLaunchingTasks(CSVGlobalState *this,CSVFileScan *file)

{
  this->initialized = false;
  ::std::__shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<duckdb::CSVBufferUsage,_(__gnu_cxx::_Lock_policy)2> *)
             &this->current_buffer_in_use);
  FinishTask(this,file);
  return;
}

Assistant:

void CSVGlobalState::FinishLaunchingTasks(CSVFileScan &file) {
	initialized = false;
	current_buffer_in_use.reset();
	// we are finished launching tasks for this file
	// finish a task to indicate we can begin cleanup once all scans are done
	FinishTask(file);
}